

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsplitter.cpp
# Opt level: O2

int __thiscall QSplitter::qt_metacall(QSplitter *this,Call _c,int _id,void **_a)

{
  int _id_00;
  
  _id_00 = QFrame::qt_metacall(&this->super_QFrame,_c,_id,_a);
  if ((-1 < _id_00) && (_c < CustomCall)) {
    if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
      if (_c == InvokeMetaMethod) {
        if (_id_00 == 0) {
          qt_static_metacall((QObject *)this,InvokeMetaMethod,0,_a);
        }
      }
      else {
        if (_c != RegisterMethodArgumentMetaType) {
          return _id_00;
        }
        if (_id_00 == 0) {
          *(undefined8 *)*_a = 0;
        }
      }
      _id_00 = _id_00 + -1;
    }
    else {
      qt_static_metacall((QObject *)this,_c,_id_00,_a);
      _id_00 = _id_00 + -4;
    }
  }
  return _id_00;
}

Assistant:

int QSplitter::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QFrame::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}